

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall
Catch::Matchers::MatcherUntypedBase::toString_abi_cxx11_(MatcherUntypedBase *this)

{
  ulong uVar1;
  long *in_RSI;
  string *in_RDI;
  string local_30 [48];
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    (**(code **)(*in_RSI + 0x10))(local_30);
    std::__cxx11::string::operator=((string *)(in_RSI + 1),local_30);
    std::__cxx11::string::~string(local_30);
  }
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 1));
  return in_RDI;
}

Assistant:

std::string MatcherUntypedBase::toString() const {
        if (m_cachedToString.empty()) {
            m_cachedToString = describe();
        }
        return m_cachedToString;
    }